

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ninja.cc
# Opt level: O0

int anon_unknown.dwarf_3c4::ToolTargetsList
              (vector<Node_*,_std::allocator<Node_*>_> *nodes,int depth,int indent)

{
  bool bVar1;
  reference ppNVar2;
  undefined8 uVar3;
  Edge *pEVar4;
  undefined8 uVar5;
  char *target;
  const_iterator cStack_28;
  int i;
  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_20;
  const_iterator n;
  int indent_local;
  int depth_local;
  vector<Node_*,_std::allocator<Node_*>_> *nodes_local;
  
  n._M_current._0_4_ = indent;
  n._M_current._4_4_ = depth;
  local_20._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin(nodes);
  while( true ) {
    cStack_28 = std::vector<Node_*,_std::allocator<Node_*>_>::end(nodes);
    bVar1 = __gnu_cxx::operator!=(&local_20,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    for (target._4_4_ = 0; target._4_4_ < (int)n._M_current; target._4_4_ = target._4_4_ + 1) {
      printf("  ");
    }
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_20);
    Node::path_abi_cxx11_(*ppNVar2);
    uVar3 = std::__cxx11::string::c_str();
    ppNVar2 = __gnu_cxx::
              __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
              operator*(&local_20);
    pEVar4 = Node::in_edge(*ppNVar2);
    if (pEVar4 == (Edge *)0x0) {
      printf("%s\n",uVar3);
    }
    else {
      ppNVar2 = __gnu_cxx::
                __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                operator*(&local_20);
      pEVar4 = Node::in_edge(*ppNVar2);
      Rule::name_abi_cxx11_(pEVar4->rule_);
      uVar5 = std::__cxx11::string::c_str();
      printf("%s: %s\n",uVar3,uVar5);
      if ((1 < n._M_current._4_4_) || (n._M_current._4_4_ < 1)) {
        ppNVar2 = __gnu_cxx::
                  __normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_20);
        pEVar4 = Node::in_edge(*ppNVar2);
        ToolTargetsList(&pEVar4->inputs_,n._M_current._4_4_ + -1,(int)n._M_current + 1);
      }
    }
    __gnu_cxx::__normal_iterator<Node_*const_*,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
    operator++(&local_20);
  }
  return 0;
}

Assistant:

int ToolTargetsList(const vector<Node*>& nodes, int depth, int indent) {
  for (vector<Node*>::const_iterator n = nodes.begin();
       n != nodes.end();
       ++n) {
    for (int i = 0; i < indent; ++i)
      printf("  ");
    const char* target = (*n)->path().c_str();
    if ((*n)->in_edge()) {
      printf("%s: %s\n", target, (*n)->in_edge()->rule_->name().c_str());
      if (depth > 1 || depth <= 0)
        ToolTargetsList((*n)->in_edge()->inputs_, depth - 1, indent + 1);
    } else {
      printf("%s\n", target);
    }
  }
  return 0;
}